

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeEventQueryTimestampsExp
          (ze_event_handle_t hEvent,ze_device_handle_t hDevice,uint32_t *pCount,
          ze_kernel_timestamp_result_t *pTimestamps)

{
  ze_pfnEventQueryTimestampsExp_t pfnQueryTimestampsExp;
  dditable_t *dditable;
  ze_result_t result;
  ze_kernel_timestamp_result_t *pTimestamps_local;
  uint32_t *pCount_local;
  ze_device_handle_t hDevice_local;
  ze_event_handle_t hEvent_local;
  
  if (*(code **)(*(long *)(hEvent + 8) + 0x4f0) == (code *)0x0) {
    hEvent_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hEvent_local._4_4_ =
         (**(code **)(*(long *)(hEvent + 8) + 0x4f0))
                   (*(undefined8 *)hEvent,*(undefined8 *)hDevice,pCount,pTimestamps);
  }
  return hEvent_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventQueryTimestampsExp(
        ze_event_handle_t hEvent,                       ///< [in] handle of the event
        ze_device_handle_t hDevice,                     ///< [in] handle of the device to query
        uint32_t* pCount,                               ///< [in,out] pointer to the number of timestamp results.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of timestamps available.
                                                        ///< if count is greater than the number of timestamps available, then the
                                                        ///< driver shall update the value with the correct number of timestamps available.
        ze_kernel_timestamp_result_t* pTimestamps       ///< [in,out][optional][range(0, *pCount)] array of timestamp results.
                                                        ///< if count is less than the number of timestamps available, then driver
                                                        ///< shall only retrieve that number of timestamps.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_event_object_t*>( hEvent )->dditable;
        auto pfnQueryTimestampsExp = dditable->ze.EventExp.pfnQueryTimestampsExp;
        if( nullptr == pfnQueryTimestampsExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hEvent = reinterpret_cast<ze_event_object_t*>( hEvent )->handle;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<ze_device_object_t*>( hDevice )->handle;

        // forward to device-driver
        result = pfnQueryTimestampsExp( hEvent, hDevice, pCount, pTimestamps );

        return result;
    }